

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O2

bool __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::isEmptyValue(CapnpcCapnpMain *this,Reader value)

{
  bool bVar1;
  
  bVar1 = true;
  if (value._reader.dataSize < 0x10) {
    return true;
  }
  switch(*value._reader.data) {
  case 1:
    if (value._reader.dataSize != 0x10) {
      bVar1 = (*(byte *)((long)value._reader.data + 2) & 1) == 0;
    }
    break;
  case 2:
  case 6:
    if (0x17 < value._reader.dataSize) {
      bVar1 = *(char *)((long)value._reader.data + 2) == '\0';
    }
    break;
  case 3:
  case 7:
  case 0xf:
    if (0x1f < value._reader.dataSize) {
      bVar1 = *(short *)((long)value._reader.data + 2) == 0;
    }
    break;
  case 4:
  case 8:
    if (0x3f < value._reader.dataSize) {
      bVar1 = *(int *)((long)value._reader.data + 4) == 0;
    }
    break;
  case 5:
  case 9:
    if (0x7f < value._reader.dataSize) {
      bVar1 = *(long *)((long)value._reader.data + 8) == 0;
    }
    break;
  case 10:
    if (value._reader.dataSize < 0x40) {
      return true;
    }
    bVar1 = *(float *)((long)value._reader.data + 4) == 0.0;
    goto LAB_0015182f;
  case 0xb:
    if (value._reader.dataSize < 0x80) {
      return true;
    }
    bVar1 = *(double *)((long)value._reader.data + 8) == 0.0;
LAB_0015182f:
    bVar1 = (bool)(-bVar1 & 1);
    break;
  case 0xc:
    bVar1 = capnp::schema::Value::Reader::hasText(&value);
    goto LAB_00151819;
  case 0xd:
    bVar1 = capnp::schema::Value::Reader::hasData(&value);
    goto LAB_00151819;
  case 0xe:
    bVar1 = capnp::schema::Value::Reader::hasList(&value);
    goto LAB_00151819;
  case 0x10:
    bVar1 = capnp::schema::Value::Reader::hasStruct(&value);
LAB_00151819:
    bVar1 = (bool)(bVar1 ^ 1);
  }
  return bVar1;
}

Assistant:

bool isEmptyValue(schema::Value::Reader value) {
    switch (value.which()) {
      case schema::Value::VOID: return true;
      case schema::Value::BOOL: return value.getBool() == false;
      case schema::Value::INT8: return value.getInt8() == 0;
      case schema::Value::INT16: return value.getInt16() == 0;
      case schema::Value::INT32: return value.getInt32() == 0;
      case schema::Value::INT64: return value.getInt64() == 0;
      case schema::Value::UINT8: return value.getUint8() == 0;
      case schema::Value::UINT16: return value.getUint16() == 0;
      case schema::Value::UINT32: return value.getUint32() == 0;
      case schema::Value::UINT64: return value.getUint64() == 0;
      case schema::Value::FLOAT32: return value.getFloat32() == 0;
      case schema::Value::FLOAT64: return value.getFloat64() == 0;
      case schema::Value::TEXT: return !value.hasText();
      case schema::Value::DATA: return !value.hasData();
      case schema::Value::LIST: return !value.hasList();
      case schema::Value::ENUM: return value.getEnum() == 0;
      case schema::Value::STRUCT: return !value.hasStruct();
      case schema::Value::INTERFACE: return true;
      case schema::Value::ANY_POINTER: return true;
    }
    return true;
  }